

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SMDLoader.cpp
# Opt level: O2

void __thiscall
Assimp::SMDImporter::ParseTrianglesSection(SMDImporter *this,char *szCurrent,char **szCurrentOut)

{
  bool bVar1;
  char *szCurrent_local;
  
  szCurrent_local = szCurrent;
  while( true ) {
    bVar1 = SkipSpacesAndLineEnd(this,szCurrent_local,&szCurrent_local);
    if (!bVar1) break;
    bVar1 = TokenMatch<char_const>(&szCurrent_local,"end",3);
    if (bVar1) break;
    ParseTriangle(this,szCurrent_local,&szCurrent_local);
  }
  SkipSpacesAndLineEnd(this,szCurrent_local,&szCurrent_local);
  *szCurrentOut = szCurrent_local;
  return;
}

Assistant:

void SMDImporter::ParseTrianglesSection(const char* szCurrent, const char** szCurrentOut) {
    // Parse a triangle, parse another triangle, parse the next triangle ...
    // and so on until we reach a token that looks quite similar to "end"
    for ( ;; ) {
        if(!SkipSpacesAndLineEnd(szCurrent,&szCurrent)) {
            break;
        }

        // "end\n" - Ends the triangles section
        if (TokenMatch(szCurrent,"end",3)) {
            break;
        }
        ParseTriangle(szCurrent,&szCurrent);
    }
    SkipSpacesAndLineEnd(szCurrent,&szCurrent);
    *szCurrentOut = szCurrent;
}